

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O2

void * rw::malloc_managed(size_t sz,uint32 hint)

{
  void *pvVar1;
  void *pvVar2;
  
  if (sz != 0) {
    pvVar1 = malloc(sz + 0x3f);
    if (pvVar1 == (void *)0x0) {
      pvVar2 = (void *)0x0;
    }
    else {
      totalMemoryAllocated = totalMemoryAllocated + sz;
      pvVar2 = (void *)((long)pvVar1 + 0x3fU & 0xfffffffffffffff0);
      *(size_t *)((long)pvVar2 - 0x30) = sz;
      *(uint32 *)((long)pvVar2 - 0x28) = hint;
      *(void **)((long)pvVar2 - 0x20) = pvVar1;
      *(undefined8 *)((long)pvVar2 - 0x18) = allocLocation;
      *(long *)((long)pvVar2 - 0x10) = allocations;
      *(long **)((long)pvVar2 - 8) = &allocations;
      *(ulong *)(allocations + 8) = (long)pvVar2 - 0x10U;
      allocations = (long)pvVar2 - 0x10U;
    }
    return pvVar2;
  }
  return (void *)0x0;
}

Assistant:

void*
malloc_managed(size_t sz, uint32 hint)
{
	void *origPtr;
	uint8 *data;
	MemoryBlock *mem;

	if(sz == 0) return nil;
	origPtr = malloc(sz + sizeof(MemoryBlock) + 15);
	if(origPtr == nil)
		return nil;
	totalMemoryAllocated += sz;
	data = (uint8*)origPtr;
	data += sizeof(MemoryBlock);
	data = (uint8*)ALIGN16((uintptr)data);
	mem = (MemoryBlock*)(data-sizeof(MemoryBlock));

	mem->sz = sz;
	mem->hint = hint;
	mem->origPtr = origPtr;
	mem->codeline = allocLocation;
	allocations.add(&mem->inAllocList);

	return data;
}